

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_virtual.c
# Opt level: O3

la_ssize_t archive_write_data_block(archive *a,void *buff,size_t s,int64_t o)

{
  _func_ssize_t_archive_ptr_void_ptr_size_t_int64_t *UNRECOVERED_JUMPTABLE;
  ssize_t sVar1;
  
  UNRECOVERED_JUMPTABLE = a->vtable->archive_write_data_block;
  if (UNRECOVERED_JUMPTABLE != (_func_ssize_t_archive_ptr_void_ptr_size_t_int64_t *)0x0) {
    sVar1 = (*UNRECOVERED_JUMPTABLE)(a,buff,s,o);
    return sVar1;
  }
  archive_set_error(a,-1,"archive_write_data_block not supported");
  a->state = 0x8000;
  return -0x1e;
}

Assistant:

ssize_t
archive_write_data_block(struct archive *a, const void *buff, size_t s, int64_t o)
{
	if (a->vtable->archive_write_data_block == NULL) {
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "archive_write_data_block not supported");
		a->state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}
	return ((a->vtable->archive_write_data_block)(a, buff, s, o));
}